

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

t_operand __thiscall
xemmai::ast::t_try::f_emit(t_try *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  t_targets *ptVar1;
  t_scope *a_emit_00;
  bool bVar2;
  t_label *ptVar3;
  t_label *ptVar4;
  t_emit *ptVar5;
  t_label *ptVar6;
  t_label *a_label;
  reference this_00;
  pointer ptVar7;
  pointer ptVar8;
  t_operand tVar9;
  t_label *local_1e8;
  t_label *local_1e0;
  unsigned_long local_1d0;
  t_block *local_1c0;
  t_label *local_1b0;
  t_label *local_1a0;
  undefined1 local_188 [8];
  anon_class_16_2_864c0342 join;
  t_label *step;
  t_label *return0;
  t_label *continue0;
  t_label *break0;
  size_t break_stack;
  anon_class_16_2_864c0342 operand;
  t_targets targets2;
  t_label *label0;
  unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_> *p;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>
  *__range2;
  t_targets targets1;
  t_label *return0_1;
  t_label *continue0_1;
  t_label *break0_1;
  t_targets *targets0;
  t_label *finally0;
  t_label *catch0;
  size_t stack;
  bool a_clear_local;
  bool a_operand_local;
  t_scope *ptStack_28;
  bool a_tail_local;
  t_emit *a_emit_local;
  t_try *this_local;
  anon_union_8_4_0f1077ea_for_t_operand_2 local_10;
  
  stack._5_1_ = a_clear;
  stack._6_1_ = a_operand;
  stack._7_1_ = a_tail;
  ptStack_28 = (t_scope *)a_emit;
  a_emit_local = (t_emit *)this;
  t_emit::f_join(a_emit,&this->v_junction_try);
  t_emit::f_merge((t_emit *)ptStack_28,&this->v_junction_try);
  catch0 = *(t_label **)&(ptStack_28->v_references)._M_t._M_impl.super__Rb_tree_header._M_header;
  ptVar3 = t_emit::f_label((t_emit *)ptStack_28);
  ptVar4 = t_emit::f_label((t_emit *)ptStack_28);
  ptVar5 = t_emit::operator<<((t_emit *)ptStack_28,c_instruction__TRY);
  ptVar5 = t_emit::operator<<(ptVar5,(unsigned_long)catch0);
  ptVar5 = t_emit::operator<<(ptVar5,ptVar3);
  t_emit::operator<<(ptVar5,ptVar4);
  ptVar1 = (t_targets *)
           (ptStack_28->v_references)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ptVar6 = t_emit::f_label((t_emit *)ptStack_28);
  a_label = t_emit::f_label((t_emit *)ptStack_28);
  targets1._72_8_ = t_emit::f_label((t_emit *)ptStack_28);
  local_1a0 = ptVar6;
  if (ptVar1->v_break == (t_label *)0x0) {
    local_1a0 = (t_label *)0x0;
  }
  __range2 = (vector<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>
              *)local_1a0;
  targets1.v_break = (t_label *)&this->v_junction_finally;
  targets1.v_break_junction = (t_block *)catch0;
  targets1.v_break_stack._0_1_ = 0;
  targets1.v_break_stack._1_1_ = ptVar1->v_break_must_clear & 1;
  local_1b0 = a_label;
  if (ptVar1->v_continue == (t_label *)0x0) {
    local_1b0 = (t_label *)0x0;
  }
  targets1._24_8_ = local_1b0;
  targets1.v_continue = (t_label *)&this->v_junction_finally;
  local_1c0 = (t_block *)targets1._72_8_;
  if (ptVar1->v_return == (t_label *)0x0) {
    local_1c0 = (t_block *)0x0;
  }
  targets1.v_continue_junction = local_1c0;
  targets1.v_return = (t_label *)&this->v_junction_finally;
  targets1.v_return_junction = (t_block *)catch0;
  targets1.v_return_stack._0_1_ = 0;
  (ptStack_28->v_references)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)&__range2;
  anon_unknown_11::f_emit_block
            ((t_emit *)ptStack_28,&this->v_block,false,(bool)(stack._5_1_ & 1),false);
  ptVar5 = t_emit::operator<<((t_emit *)ptStack_28,c_instruction__FINALLY);
  t_emit::operator<<(ptVar5,c_try__STEP);
  t_emit::f_target((t_emit *)ptStack_28,ptVar3);
  __end2 = std::
           vector<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>
           ::begin(&this->v_catches);
  p = (unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_> *)
      std::
      vector<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>
      ::end(&this->v_catches);
  while (bVar2 = __gnu_cxx::
                 operator==<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>_>
                           (&__end2,(__normal_iterator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>_>
                                     *)&p), ((bVar2 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>_>
              ::operator*(&__end2);
    if ((stack._5_1_ & 1) == 0) {
      t_emit::f_pop((t_emit *)ptStack_28);
    }
    ptVar7 = std::
             unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>
             ::operator->(this_00);
    ptVar8 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
             operator->(&ptVar7->v_expression);
    (*ptVar8->_vptr_t_node[3])(ptVar8,ptStack_28,0,0);
    ptVar3 = t_emit::f_label((t_emit *)ptStack_28);
    ptVar5 = t_emit::f_pop((t_emit *)ptStack_28);
    ptVar5 = t_emit::operator<<(ptVar5,c_instruction__CATCH);
    ptVar5 = t_emit::operator<<(ptVar5,ptVar3);
    ptVar7 = std::
             unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>
             ::operator->(this_00);
    if ((ptVar7->v_variable->v_shared & 1U) == 0) {
      ptVar7 = std::
               unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>
               ::operator->(this_00);
      local_1d0 = ptVar7->v_variable->v_index;
    }
    else {
      ptVar7 = std::
               unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>
               ::operator->(this_00);
      local_1d0 = ptVar7->v_variable->v_index ^ 0xffffffffffffffff;
    }
    t_emit::operator<<(ptVar5,local_1d0);
    a_emit_00 = ptStack_28;
    ptVar7 = std::
             unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>
             ::operator->(this_00);
    anon_unknown_11::f_emit_block
              ((t_emit *)a_emit_00,&ptVar7->v_block,false,(bool)(stack._5_1_ & 1),false);
    ptVar5 = t_emit::operator<<((t_emit *)ptStack_28,c_instruction__FINALLY);
    t_emit::operator<<(ptVar5,c_try__STEP);
    t_emit::f_target((t_emit *)ptStack_28,ptVar3);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>_>
    ::operator++(&__end2);
  }
  ptVar5 = t_emit::operator<<((t_emit *)ptStack_28,c_instruction__FINALLY);
  t_emit::operator<<(ptVar5,c_try__THROW);
  t_emit::f_target((t_emit *)ptStack_28,ptVar6);
  ptVar5 = t_emit::operator<<((t_emit *)ptStack_28,c_instruction__FINALLY);
  t_emit::operator<<(ptVar5,c_try__BREAK);
  t_emit::f_target((t_emit *)ptStack_28,a_label);
  ptVar5 = t_emit::operator<<((t_emit *)ptStack_28,c_instruction__FINALLY);
  t_emit::operator<<(ptVar5,c_try__CONTINUE);
  t_emit::f_target((t_emit *)ptStack_28,(t_label *)targets1._72_8_);
  ptVar5 = t_emit::operator<<((t_emit *)ptStack_28,c_instruction__FINALLY);
  t_emit::operator<<(ptVar5,c_try__RETURN);
  t_emit::f_target((t_emit *)ptStack_28,ptVar4);
  memset(&operand.stack,0,0x50);
  (ptStack_28->v_references)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)&operand.stack;
  if ((stack._5_1_ & 1) != 0) {
    t_emit::f_push((t_emit *)ptStack_28);
  }
  anon_unknown_11::f_emit_block_without_value((t_emit *)ptStack_28,&this->v_finally);
  if ((stack._5_1_ & 1) != 0) {
    t_emit::f_pop((t_emit *)ptStack_28);
  }
  t_emit::operator<<((t_emit *)ptStack_28,c_instruction__YRT);
  break_stack = (size_t)ptStack_28;
  operand.a_emit = (t_emit *)&catch0;
  if ((ptVar1->v_break_must_clear & 1U) == 0) {
    local_1e0 = (t_label *)ptVar1->v_break_stack;
  }
  else {
    local_1e0 = catch0;
  }
  ptVar3 = f_emit::anon_class_16_2_864c0342::operator()
                     ((anon_class_16_2_864c0342 *)&break_stack,ptVar1->v_break,
                      ptVar1->v_break_junction,(size_t)local_1e0);
  ptVar4 = f_emit::anon_class_16_2_864c0342::operator()
                     ((anon_class_16_2_864c0342 *)&break_stack,ptVar1->v_continue,
                      ptVar1->v_continue_junction,(size_t)catch0);
  ptVar6 = f_emit::anon_class_16_2_864c0342::operator()
                     ((anon_class_16_2_864c0342 *)&break_stack,ptVar1->v_return,
                      ptVar1->v_return_junction,ptVar1->v_return_stack);
  if (((ptVar3 == (t_label *)0x0) && (ptVar4 == (t_label *)0x0)) && (ptVar6 == (t_label *)0x0)) {
    local_1e8 = (t_label *)0x0;
  }
  else {
    local_1e8 = t_emit::f_label((t_emit *)ptStack_28);
  }
  join.stack = (size_t *)local_1e8;
  if (local_1e8 != (t_label *)0x0) {
    ptVar5 = t_emit::operator<<((t_emit *)ptStack_28,c_instruction__JUMP);
    t_emit::operator<<(ptVar5,(t_label *)join.stack);
  }
  local_188 = (undefined1  [8])ptStack_28;
  join.a_emit = (t_emit *)&catch0;
  f_emit::anon_class_16_2_864c0342::operator()
            ((anon_class_16_2_864c0342 *)local_188,ptVar3,ptVar1->v_break,ptVar1->v_break_junction,
             (size_t)local_1e0);
  f_emit::anon_class_16_2_864c0342::operator()
            ((anon_class_16_2_864c0342 *)local_188,ptVar4,ptVar1->v_continue,
             ptVar1->v_continue_junction,(size_t)catch0);
  f_emit::anon_class_16_2_864c0342::operator()
            ((anon_class_16_2_864c0342 *)local_188,ptVar6,ptVar1->v_return,ptVar1->v_return_junction
             ,ptVar1->v_return_stack);
  if (join.stack != (size_t *)0x0) {
    t_emit::f_target((t_emit *)ptStack_28,(t_label *)join.stack);
  }
  (ptStack_28->v_references)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)ptVar1;
  t_operand::t_operand((t_operand *)&this_local);
  tVar9._4_4_ = 0;
  tVar9.v_tag = (uint)this_local;
  tVar9.field_1.v_integer = local_10.v_integer;
  return tVar9;
}

Assistant:

t_operand t_try::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	a_emit.f_join(v_junction_try);
	a_emit.f_merge(v_junction_try);
	auto stack = a_emit.v_stack;
	auto& catch0 = a_emit.f_label();
	auto& finally0 = a_emit.f_label();
	a_emit << c_instruction__TRY << stack << catch0 << finally0;
	auto targets0 = a_emit.v_targets;
	{
		auto& break0 = a_emit.f_label();
		auto& continue0 = a_emit.f_label();
		auto& return0 = a_emit.f_label();
		t_emit::t_targets targets1{targets0->v_break ? &break0 : nullptr, &v_junction_finally, stack, false, targets0->v_break_must_clear, targets0->v_continue ? &continue0 : nullptr, &v_junction_finally, targets0->v_return ? &return0 : nullptr, &v_junction_finally, stack, false};
		a_emit.v_targets = &targets1;
		f_emit_block(a_emit, v_block, false, a_clear);
		a_emit << c_instruction__FINALLY << t_code::c_try__STEP;
		a_emit.f_target(catch0);
		for (auto& p : v_catches) {
			if (!a_clear) a_emit.f_pop();
			p->v_expression->f_emit(a_emit, false, false);
			auto& label0 = a_emit.f_label();
			a_emit.f_pop() << c_instruction__CATCH << label0 << (p->v_variable.v_shared ? ~p->v_variable.v_index : p->v_variable.v_index);
			f_emit_block(a_emit, p->v_block, false, a_clear);
			a_emit << c_instruction__FINALLY << t_code::c_try__STEP;
			a_emit.f_target(label0);
		}
		a_emit << c_instruction__FINALLY << t_code::c_try__THROW;
		a_emit.f_target(break0);
		a_emit << c_instruction__FINALLY << t_code::c_try__BREAK;
		a_emit.f_target(continue0);
		a_emit << c_instruction__FINALLY << t_code::c_try__CONTINUE;
		a_emit.f_target(return0);
		a_emit << c_instruction__FINALLY << t_code::c_try__RETURN;
	}
	a_emit.f_target(finally0);
	{
		t_emit::t_targets targets2{nullptr, nullptr, 0, false, false, nullptr, nullptr, nullptr, nullptr, 0, false};
		a_emit.v_targets = &targets2;
		if (a_clear) a_emit.f_push();
		f_emit_block_without_value(a_emit, v_finally);
		if (a_clear) a_emit.f_pop();
	}
	a_emit << c_instruction__YRT;
	auto operand = [&](t_emit::t_label* a_label, t_block* a_junction, size_t a_stack) -> t_emit::t_label*
	{
		if (!a_label) {
			a_emit << size_t(0);
			return nullptr;
		}
		auto jump = [&]
		{
			auto label = &a_emit.f_label();
			a_emit << *label;
			return label;
		};
		if (stack > a_stack) return jump();
		for (size_t i = 0; i < a_junction->v_privates.size(); ++i) {
			if ((*a_emit.v_privates)[i]) continue;
			auto& x = a_junction->v_privates[i];
			if (x.v_use && x.v_in) return jump();
		}
		a_emit << *a_label;
		return nullptr;
	};
	auto break_stack = targets0->v_break_must_clear ? stack : targets0->v_break_stack;
	auto break0 = operand(targets0->v_break, targets0->v_break_junction, break_stack);
	auto continue0 = operand(targets0->v_continue, targets0->v_continue_junction, stack);
	auto return0 = operand(targets0->v_return, targets0->v_return_junction, targets0->v_return_stack);
	auto step = break0 || continue0 || return0 ? &a_emit.f_label() : nullptr;
	if (step) a_emit << c_instruction__JUMP << *step;
	auto join = [&](t_emit::t_label* a_label0, t_emit::t_label* a_label1, t_block* a_junction, size_t a_stack)
	{
		if (!a_label0) return;
		a_emit.f_target(*a_label0);
		if (stack > a_stack) a_emit << c_instruction__STACK_GET << a_stack << stack;
		a_emit.f_join(*a_junction);
		a_emit << c_instruction__JUMP << *a_label1;
	};
	join(break0, targets0->v_break, targets0->v_break_junction, break_stack);
	join(continue0, targets0->v_continue, targets0->v_continue_junction, stack);
	join(return0, targets0->v_return, targets0->v_return_junction, targets0->v_return_stack);
	if (step) a_emit.f_target(*step);
	a_emit.v_targets = targets0;
	return {};
}